

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapepiram.cpp
# Opt level: O0

int pzshape::TPZShapePiram::NConnectShapeF(int side,int order)

{
  ostream *this;
  void *this_00;
  int in_ESI;
  int in_EDI;
  int i;
  int sum;
  int totsum;
  int local_18;
  int local_10;
  int local_4;
  
  if (in_EDI < 5) {
    local_4 = 1;
  }
  else if (in_EDI < 0xd) {
    local_4 = in_ESI + -1;
  }
  else if (in_EDI == 0xd) {
    local_4 = (in_ESI + -1) * (in_ESI + -1);
  }
  else if (in_EDI < 0x12) {
    local_4 = ((in_ESI + -2) * (in_ESI + -1)) / 2;
  }
  else if (in_EDI == 0x12) {
    local_10 = 0;
    for (local_18 = 1; local_18 < in_ESI + -1; local_18 = local_18 + 1) {
      local_10 = (local_18 * (local_18 + 1)) / 2 + local_10;
    }
    local_4 = local_10;
  }
  else {
    this = std::operator<<((ostream *)&std::cerr,
                           "TPZShapePiram::NConnectShapeF, bad parameter side ");
    this_00 = (void *)std::ostream::operator<<(this,in_EDI);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int TPZShapePiram::NConnectShapeF(int side, int order) {
		if(side<5) return 1;//0 a 4
		//   int s = side-5;//s = 0 a 14 ou side = 6 a 20
		if(side<13) return (order-1);//6 a 14
		if(side==13) {
			return ((order-1)*(order-1));
		}
		if(side<18) {//16,17,18
			return ((order-2)*(order-1)/2);
		}
		if(side==18) {
			int totsum = 0,sum;
			for(int i=1;i<order-1;i++) {
				sum = i*(i+1) / 2;
				totsum += sum;
			}
			return totsum;
		}
		PZError << "TPZShapePiram::NConnectShapeF, bad parameter side " << side << endl;
		return 0;
	}